

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplicialCholesky.h
# Opt level: O2

void __thiscall
Eigen::
SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
::ordering(SimplicialCholeskyBase<Eigen::SimplicialLDLT<Eigen::SparseMatrix<double,_0,_int>,_1,_Eigen::AMDOrdering<int>_>_>
           *this,MatrixType *a,ConstCholMatrixPtr *pmat,CholMatrixType *ap)

{
  Index rows;
  OrderingType ordering;
  CholMatrixType C;
  SparseSelfAdjointView<const_Eigen::SparseMatrix<double,_0,_int>,_1U> local_78;
  MatrixType *local_70;
  PermutationMatrix<_1,__1,_int> *local_68;
  
  rows = a->m_innerSize;
  *pmat = ap;
  SparseMatrix<double,_0,_int>::SparseMatrix((SparseMatrix<double,_0,_int> *)&local_70);
  local_78.m_matrix = a;
  internal::
  call_assignment_no_alias<Eigen::SparseMatrix<double,0,int>,Eigen::SparseSelfAdjointView<Eigen::SparseMatrix<double,0,int>const,1u>>
            ((SparseMatrix<double,_0,_int> *)&local_70,&local_78);
  AMDOrdering<int>::operator()
            ((AMDOrdering<int> *)&local_78,(SparseMatrix<double,_0,_int> *)&local_70,&this->m_Pinv);
  SparseMatrix<double,_0,_int>::~SparseMatrix((SparseMatrix<double,_0,_int> *)&local_70);
  if ((this->m_Pinv).m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.m_storage
      .m_rows < 1) {
    PlainObjectBase<Eigen::Matrix<int,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_> *)&this->m_P,0);
  }
  else {
    local_78.m_matrix = (MatrixTypeNested)&this->m_Pinv;
    PermutationMatrix<-1,-1,int>::PermutationMatrix<Eigen::PermutationMatrix<_1,_1,int>>
              ((PermutationMatrix<_1,_1,int> *)&local_70,
               (InverseImpl<Eigen::PermutationMatrix<_1,__1,_int>,_Eigen::PermutationStorage> *)
               &local_78);
    internal::call_assignment<Eigen::Matrix<int,_1,1,0,_1,1>,Eigen::Matrix<int,_1,1,0,_1,1>>
              (&(this->m_P).m_indices,(Matrix<int,__1,_1,_0,__1,_1> *)&local_70);
    free(local_70);
  }
  SparseMatrix<double,_0,_int>::resize(ap,rows,rows);
  local_68 = &this->m_P;
  local_78.m_matrix = ap;
  local_70 = a;
  internal::
  call_assignment_no_alias_no_transpose<Eigen::SparseSelfAdjointView<Eigen::SparseMatrix<double,0,int>,2u>,Eigen::SparseSymmetricPermutationProduct<Eigen::SparseMatrix<double,0,int>,1>>
            ((SparseSelfAdjointView<Eigen::SparseMatrix<double,_0,_int>,_2U> *)&local_78,
             (SparseSymmetricPermutationProduct<Eigen::SparseMatrix<double,_0,_int>,_1> *)&local_70)
  ;
  return;
}

Assistant:

void SimplicialCholeskyBase<Derived>::ordering(const MatrixType& a, ConstCholMatrixPtr &pmat, CholMatrixType& ap)
{
  eigen_assert(a.rows()==a.cols());
  const Index size = a.rows();
  pmat = &ap;
  // Note that ordering methods compute the inverse permutation
  if(!internal::is_same<OrderingType,NaturalOrdering<Index> >::value)
  {
    {
      CholMatrixType C;
      C = a.template selfadjointView<UpLo>();
      
      OrderingType ordering;
      ordering(C,m_Pinv);
    }

    if(m_Pinv.size()>0) m_P = m_Pinv.inverse();
    else                m_P.resize(0);
    
    ap.resize(size,size);
    ap.template selfadjointView<Upper>() = a.template selfadjointView<UpLo>().twistedBy(m_P);
  }
  else
  {
    m_Pinv.resize(0);
    m_P.resize(0);
    if(int(UpLo)==int(Lower) || MatrixType::IsRowMajor)
    {
      // we have to transpose the lower part to to the upper one
      ap.resize(size,size);
      ap.template selfadjointView<Upper>() = a.template selfadjointView<UpLo>();
    }
    else
      internal::simplicial_cholesky_grab_input<CholMatrixType,MatrixType>::run(a, pmat, ap);
  }  
}